

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,size_t i)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  BufferView<embree::Vec3fa> *pBVar5;
  char *pcVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  vfloat4 a0_1;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  vfloat4 a0_2;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  vfloat4 b0;
  float fVar66;
  float fVar67;
  vfloat4 b0_1;
  undefined1 auVar68 [16];
  float fVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar72;
  float fVar74;
  float fVar75;
  undefined1 auVar73 [16];
  float fVar76;
  float fVar77;
  float fVar79;
  float fVar80;
  undefined1 auVar78 [16];
  float fVar81;
  float fVar82;
  undefined1 auVar83 [16];
  float fVar84;
  vfloat4 a0;
  undefined1 auVar85 [16];
  
  pBVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar1 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar3 = (pBVar2->super_RawBufferView).ptr_ofs;
  sVar4 = (pBVar2->super_RawBufferView).stride;
  lVar14 = sVar4 * uVar1;
  lVar15 = sVar4 * (uVar1 + 1);
  lVar12 = sVar4 * (uVar1 + 2);
  lVar13 = sVar4 * (uVar1 + 3);
  fVar69 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           maxRadiusScale;
  auVar55 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar14),
                          ZEXT416((uint)(fVar69 * *(float *)(pcVar3 + lVar14 + 0xc))),0x30);
  auVar56 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar15),
                          ZEXT416((uint)(fVar69 * *(float *)(pcVar3 + lVar15 + 0xc))),0x30);
  pBVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           normals.items;
  pcVar6 = (pBVar5->super_RawBufferView).ptr_ofs;
  sVar4 = (pBVar5->super_RawBufferView).stride;
  auVar19 = *(undefined1 (*) [16])(pcVar6 + uVar1 * sVar4);
  auVar18 = *(undefined1 (*) [16])(pcVar6 + (uVar1 + 1) * sVar4);
  auVar22 = *(undefined1 (*) [16])(pcVar6 + (uVar1 + 2) * sVar4);
  auVar58 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar12),
                          ZEXT416((uint)(fVar69 * *(float *)(pcVar3 + lVar12 + 0xc))),0x30);
  auVar21 = *(undefined1 (*) [16])(pcVar6 + sVar4 * (uVar1 + 3));
  auVar73._8_4_ = 0x80000000;
  auVar73._0_8_ = 0x8000000080000000;
  auVar73._12_4_ = 0x80000000;
  auVar20 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar13),
                          ZEXT416((uint)(fVar69 * *(float *)(pcVar3 + lVar13 + 0xc))),0x30);
  fVar69 = auVar20._0_4_;
  auVar53._0_4_ = fVar69 * -0.0;
  fVar66 = auVar20._4_4_;
  auVar53._4_4_ = fVar66 * -0.0;
  fVar7 = auVar20._8_4_;
  auVar53._8_4_ = fVar7 * -0.0;
  fVar9 = auVar20._12_4_;
  auVar53._12_4_ = fVar9 * -0.0;
  auVar48._0_12_ = ZEXT812(0);
  auVar48._12_4_ = 0;
  auVar20 = vfmadd213ps_fma(ZEXT816(0),auVar58,auVar53);
  auVar47._0_4_ = auVar56._0_4_ + auVar20._0_4_;
  auVar47._4_4_ = auVar56._4_4_ + auVar20._4_4_;
  auVar47._8_4_ = auVar56._8_4_ + auVar20._8_4_;
  auVar47._12_4_ = auVar56._12_4_ + auVar20._12_4_;
  auVar47 = vfmadd231ps_fma(auVar47,auVar55,auVar73);
  auVar20._0_4_ = fVar69 * 0.0;
  auVar20._4_4_ = fVar66 * 0.0;
  auVar20._8_4_ = fVar7 * 0.0;
  auVar20._12_4_ = fVar9 * 0.0;
  auVar78._8_4_ = 0x3f000000;
  auVar78._0_8_ = 0x3f0000003f000000;
  auVar78._12_4_ = 0x3f000000;
  auVar20 = vfmadd231ps_fma(auVar20,auVar58,auVar78);
  auVar20 = vfmadd231ps_fma(auVar20,auVar56,auVar48);
  auVar57 = vfnmadd231ps_fma(auVar20,auVar55,auVar78);
  auVar83._0_4_ = auVar21._0_4_ * -0.0;
  auVar83._4_4_ = auVar21._4_4_ * -0.0;
  auVar83._8_4_ = auVar21._8_4_ * -0.0;
  auVar83._12_4_ = auVar21._12_4_ * -0.0;
  auVar20 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar22,auVar83);
  auVar85._0_4_ = auVar18._0_4_ + auVar20._0_4_;
  auVar85._4_4_ = auVar18._4_4_ + auVar20._4_4_;
  auVar85._8_4_ = auVar18._8_4_ + auVar20._8_4_;
  auVar85._12_4_ = auVar18._12_4_ + auVar20._12_4_;
  auVar20 = vfmadd231ps_fma(auVar85,auVar19,auVar73);
  auVar16 = vmulps_avx512vl(auVar21,auVar48);
  auVar16 = vfmadd231ps_avx512vl(auVar16,auVar22,auVar78);
  auVar16 = vfmadd231ps_avx512vl(auVar16,auVar18,auVar48);
  auVar17 = vfnmadd231ps_avx512vl(auVar16,auVar19,auVar78);
  auVar16._0_4_ = auVar58._0_4_ + auVar53._0_4_;
  auVar16._4_4_ = auVar58._4_4_ + auVar53._4_4_;
  auVar16._8_4_ = auVar58._8_4_ + auVar53._8_4_;
  auVar16._12_4_ = auVar58._12_4_ + auVar53._12_4_;
  auVar16 = vfmadd231ps_fma(auVar16,auVar56,auVar48);
  auVar16 = vfmadd231ps_fma(auVar16,auVar55,auVar73);
  auVar54._0_4_ = fVar69 * 0.5;
  auVar54._4_4_ = fVar66 * 0.5;
  auVar54._8_4_ = fVar7 * 0.5;
  auVar54._12_4_ = fVar9 * 0.5;
  auVar58 = vfmadd231ps_fma(auVar54,auVar48,auVar58);
  auVar56 = vfnmadd231ps_fma(auVar58,auVar78,auVar56);
  auVar58 = vfmadd231ps_fma(auVar56,auVar48,auVar55);
  auVar55._0_4_ = auVar22._0_4_ + auVar83._0_4_;
  auVar55._4_4_ = auVar22._4_4_ + auVar83._4_4_;
  auVar55._8_4_ = auVar22._8_4_ + auVar83._8_4_;
  auVar55._12_4_ = auVar22._12_4_ + auVar83._12_4_;
  auVar55 = vfmadd231ps_fma(auVar55,auVar18,auVar48);
  auVar55 = vfmadd231ps_fma(auVar55,auVar19,auVar73);
  auVar59._0_4_ = auVar21._0_4_ * 0.5;
  auVar59._4_4_ = auVar21._4_4_ * 0.5;
  auVar59._8_4_ = auVar21._8_4_ * 0.5;
  auVar59._12_4_ = auVar21._12_4_ * 0.5;
  auVar22 = vfmadd231ps_fma(auVar59,auVar48,auVar22);
  auVar18 = vfnmadd231ps_fma(auVar22,auVar18,auVar78);
  auVar56 = vfmadd231ps_fma(auVar18,auVar48,auVar19);
  auVar19 = vshufps_avx(auVar57,auVar57,0xc9);
  auVar18 = vshufps_avx(auVar20,auVar20,0xc9);
  fVar49 = auVar57._0_4_;
  auVar63._0_4_ = fVar49 * auVar18._0_4_;
  fVar50 = auVar57._4_4_;
  auVar63._4_4_ = fVar50 * auVar18._4_4_;
  fVar51 = auVar57._8_4_;
  auVar63._8_4_ = fVar51 * auVar18._8_4_;
  fVar52 = auVar57._12_4_;
  auVar63._12_4_ = fVar52 * auVar18._12_4_;
  auVar18 = vfmsub231ps_fma(auVar63,auVar19,auVar20);
  auVar22 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar18 = vshufps_avx512vl(auVar17,auVar17,0xc9);
  auVar68._0_4_ = auVar18._0_4_ * fVar49;
  auVar68._4_4_ = auVar18._4_4_ * fVar50;
  auVar68._8_4_ = auVar18._8_4_ * fVar51;
  auVar68._12_4_ = auVar18._12_4_ * fVar52;
  auVar19 = vfmsub231ps_avx512vl(auVar68,auVar19,auVar17);
  auVar21 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar19 = vshufps_avx(auVar58,auVar58,0xc9);
  auVar18 = vshufps_avx(auVar55,auVar55,0xc9);
  fVar7 = auVar58._0_4_;
  auVar70._0_4_ = auVar18._0_4_ * fVar7;
  fVar9 = auVar58._4_4_;
  auVar70._4_4_ = auVar18._4_4_ * fVar9;
  fVar8 = auVar58._8_4_;
  auVar70._8_4_ = auVar18._8_4_ * fVar8;
  fVar10 = auVar58._12_4_;
  auVar70._12_4_ = auVar18._12_4_ * fVar10;
  auVar18 = vfmsub231ps_fma(auVar70,auVar19,auVar55);
  auVar55 = vshufps_avx(auVar18,auVar18,0xc9);
  auVar18 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar71._0_4_ = auVar18._0_4_ * fVar7;
  auVar71._4_4_ = auVar18._4_4_ * fVar9;
  auVar71._8_4_ = auVar18._8_4_ * fVar8;
  auVar71._12_4_ = auVar18._12_4_ * fVar10;
  auVar19 = vfmsub231ps_fma(auVar71,auVar19,auVar56);
  auVar56 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar19 = vdpps_avx(auVar22,auVar22,0x7f);
  fVar66 = auVar19._0_4_;
  auVar18 = vrsqrt14ss_avx512f(auVar48,ZEXT416((uint)fVar66));
  fVar69 = auVar18._0_4_;
  fVar69 = fVar69 * 1.5 + fVar66 * -0.5 * fVar69 * fVar69 * fVar69;
  fVar77 = fVar69 * auVar22._0_4_;
  fVar79 = fVar69 * auVar22._4_4_;
  fVar80 = fVar69 * auVar22._8_4_;
  fVar81 = fVar69 * auVar22._12_4_;
  auVar18 = vdpps_avx(auVar22,auVar21,0x7f);
  auVar20 = vbroadcastss_avx512vl(auVar19);
  auVar21 = vmulps_avx512vl(auVar20,auVar21);
  fVar84 = auVar18._0_4_;
  auVar64._0_4_ = fVar84 * auVar22._0_4_;
  auVar64._4_4_ = fVar84 * auVar22._4_4_;
  auVar64._8_4_ = fVar84 * auVar22._8_4_;
  auVar64._12_4_ = fVar84 * auVar22._12_4_;
  auVar22 = vsubps_avx(auVar21,auVar64);
  auVar18 = vrcp14ss_avx512f(auVar48,ZEXT416((uint)fVar66));
  auVar19 = vfnmadd213ss_fma(auVar19,auVar18,SUB6416(ZEXT464(0x40000000),0));
  fVar84 = auVar18._0_4_ * auVar19._0_4_;
  auVar19 = vdpps_avx(auVar55,auVar55,0x7f);
  fVar67 = auVar19._0_4_;
  auVar18 = vrsqrt14ss_avx512f(auVar48,ZEXT416((uint)fVar67));
  fVar66 = auVar18._0_4_;
  fVar66 = fVar66 * 1.5 + fVar67 * -0.5 * fVar66 * fVar66 * fVar66;
  fVar72 = fVar66 * auVar55._0_4_;
  fVar74 = fVar66 * auVar55._4_4_;
  fVar75 = fVar66 * auVar55._8_4_;
  fVar76 = fVar66 * auVar55._12_4_;
  auVar18 = vdpps_avx(auVar55,auVar56,0x7f);
  auVar17._0_4_ = fVar67 * auVar56._0_4_;
  auVar17._4_4_ = fVar67 * auVar56._4_4_;
  auVar17._8_4_ = fVar67 * auVar56._8_4_;
  auVar17._12_4_ = fVar67 * auVar56._12_4_;
  fVar82 = auVar18._0_4_;
  auVar56._0_4_ = fVar82 * auVar55._0_4_;
  auVar56._4_4_ = fVar82 * auVar55._4_4_;
  auVar56._8_4_ = fVar82 * auVar55._8_4_;
  auVar56._12_4_ = fVar82 * auVar55._12_4_;
  auVar21 = vsubps_avx(auVar17,auVar56);
  auVar18 = vrcp14ss_avx512f(auVar48,ZEXT416((uint)fVar67));
  auVar19 = vfnmadd213ss_fma(auVar19,auVar18,SUB6416(ZEXT464(0x40000000),0));
  fVar67 = auVar19._0_4_ * auVar18._0_4_;
  auVar19 = vshufps_avx(auVar47,auVar47,0xff);
  auVar60._0_4_ = fVar77 * auVar19._0_4_;
  auVar60._4_4_ = fVar79 * auVar19._4_4_;
  auVar60._8_4_ = fVar80 * auVar19._8_4_;
  auVar60._12_4_ = fVar81 * auVar19._12_4_;
  auVar55 = vsubps_avx(auVar47,auVar60);
  auVar18 = vshufps_avx(auVar57,auVar57,0xff);
  auVar65._0_4_ = auVar18._0_4_ * fVar77 + auVar19._0_4_ * fVar69 * fVar84 * auVar22._0_4_;
  auVar65._4_4_ = auVar18._4_4_ * fVar79 + auVar19._4_4_ * fVar69 * fVar84 * auVar22._4_4_;
  auVar65._8_4_ = auVar18._8_4_ * fVar80 + auVar19._8_4_ * fVar69 * fVar84 * auVar22._8_4_;
  auVar65._12_4_ = auVar18._12_4_ * fVar81 + auVar19._12_4_ * fVar69 * fVar84 * auVar22._12_4_;
  auVar22 = vsubps_avx(auVar57,auVar65);
  auVar20 = vaddps_avx512vl(auVar47,auVar60);
  auVar19 = vshufps_avx(auVar16,auVar16,0xff);
  auVar61._0_4_ = fVar72 * auVar19._0_4_;
  auVar61._4_4_ = fVar74 * auVar19._4_4_;
  auVar61._8_4_ = fVar75 * auVar19._8_4_;
  auVar61._12_4_ = fVar76 * auVar19._12_4_;
  auVar56 = vsubps_avx(auVar16,auVar61);
  auVar18 = vshufps_avx(auVar58,auVar58,0xff);
  auVar57._0_4_ = fVar72 * auVar18._0_4_ + auVar19._0_4_ * fVar66 * auVar21._0_4_ * fVar67;
  auVar57._4_4_ = fVar74 * auVar18._4_4_ + auVar19._4_4_ * fVar66 * auVar21._4_4_ * fVar67;
  auVar57._8_4_ = fVar75 * auVar18._8_4_ + auVar19._8_4_ * fVar66 * auVar21._8_4_ * fVar67;
  auVar57._12_4_ = fVar76 * auVar18._12_4_ + auVar19._12_4_ * fVar66 * auVar21._12_4_ * fVar67;
  auVar19 = vsubps_avx(auVar58,auVar57);
  auVar18 = vaddps_avx512vl(auVar16,auVar61);
  fVar69 = auVar55._0_4_;
  auVar58._0_4_ = fVar69 + auVar22._0_4_ * 0.33333334;
  auVar58._4_4_ = auVar55._4_4_ + auVar22._4_4_ * 0.33333334;
  auVar58._8_4_ = auVar55._8_4_ + auVar22._8_4_ * 0.33333334;
  auVar58._12_4_ = auVar55._12_4_ + auVar22._12_4_ * 0.33333334;
  auVar62._0_4_ = auVar19._0_4_ * 0.33333334;
  auVar62._4_4_ = auVar19._4_4_ * 0.33333334;
  auVar62._8_4_ = auVar19._8_4_ * 0.33333334;
  auVar62._12_4_ = auVar19._12_4_ * 0.33333334;
  auVar19 = vsubps_avx(auVar56,auVar62);
  auVar22._0_4_ = (fVar49 + auVar65._0_4_) * 0.33333334;
  auVar22._4_4_ = (fVar50 + auVar65._4_4_) * 0.33333334;
  auVar22._8_4_ = (fVar51 + auVar65._8_4_) * 0.33333334;
  auVar22._12_4_ = (fVar52 + auVar65._12_4_) * 0.33333334;
  auVar22 = vaddps_avx512vl(auVar20,auVar22);
  auVar21._0_4_ = (fVar7 + auVar57._0_4_) * 0.33333334;
  auVar21._4_4_ = (fVar9 + auVar57._4_4_) * 0.33333334;
  auVar21._8_4_ = (fVar8 + auVar57._8_4_) * 0.33333334;
  auVar21._12_4_ = (fVar10 + auVar57._12_4_) * 0.33333334;
  auVar21 = vsubps_avx512vl(auVar18,auVar21);
  auVar42._8_4_ = 1;
  auVar42._0_8_ = 0x100000001;
  auVar42._12_4_ = 1;
  auVar42._16_4_ = 1;
  auVar42._20_4_ = 1;
  auVar42._24_4_ = 1;
  auVar42._28_4_ = 1;
  auVar37._4_4_ = fVar69;
  auVar37._0_4_ = fVar69;
  auVar37._8_4_ = fVar69;
  auVar37._12_4_ = fVar69;
  auVar37._16_4_ = fVar69;
  auVar37._20_4_ = fVar69;
  auVar37._24_4_ = fVar69;
  auVar37._28_4_ = fVar69;
  auVar35 = vpermps_avx2(auVar42,ZEXT1632(auVar55));
  auVar43._8_4_ = 2;
  auVar43._0_8_ = 0x200000002;
  auVar43._12_4_ = 2;
  auVar43._16_4_ = 2;
  auVar43._20_4_ = 2;
  auVar43._24_4_ = 2;
  auVar43._28_4_ = 2;
  auVar36 = vpermps_avx2(auVar43,ZEXT1632(auVar55));
  auVar23 = vbroadcastss_avx512vl(auVar58);
  auVar24 = vpermps_avx512vl(auVar42,ZEXT1632(auVar58));
  auVar25 = vpermps_avx512vl(auVar43,ZEXT1632(auVar58));
  auVar26 = vbroadcastss_avx512vl(auVar19);
  auVar27 = vpermps_avx512vl(auVar42,ZEXT1632(auVar19));
  auVar28 = vpermps_avx512vl(auVar43,ZEXT1632(auVar19));
  auVar29 = vbroadcastss_avx512vl(auVar56);
  auVar30 = vpermps_avx512vl(auVar42,ZEXT1632(auVar56));
  auVar31 = vpermps_avx512vl(auVar43,ZEXT1632(auVar56));
  auVar32 = vmulps_avx512vl(auVar29,bezier_basis0._3944_32_);
  auVar33 = vmulps_avx512vl(auVar30,bezier_basis0._3944_32_);
  auVar34 = vmulps_avx512vl(auVar31,bezier_basis0._3944_32_);
  auVar32 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._2788_32_,auVar26);
  auVar33 = vfmadd231ps_avx512vl(auVar33,bezier_basis0._2788_32_,auVar27);
  auVar34 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._2788_32_,auVar28);
  auVar32 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._1632_32_,auVar23);
  auVar33 = vfmadd231ps_avx512vl(auVar33,bezier_basis0._1632_32_,auVar24);
  auVar34 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._1632_32_,auVar25);
  auVar19 = vfmadd231ps_fma(auVar32,bezier_basis0._476_32_,auVar37);
  auVar32 = vfmadd231ps_avx512vl(auVar33,bezier_basis0._476_32_,auVar35);
  auVar33 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._476_32_,auVar36);
  auVar29 = vmulps_avx512vl(auVar29,bezier_basis0._8568_32_);
  auVar30 = vmulps_avx512vl(auVar30,bezier_basis0._8568_32_);
  auVar31 = vmulps_avx512vl(auVar31,bezier_basis0._8568_32_);
  auVar26 = vfmadd231ps_avx512vl(auVar29,bezier_basis0._7412_32_,auVar26);
  auVar27 = vfmadd231ps_avx512vl(auVar30,bezier_basis0._7412_32_,auVar27);
  auVar28 = vfmadd231ps_avx512vl(auVar31,bezier_basis0._7412_32_,auVar28);
  auVar23 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._6256_32_,auVar23);
  auVar24 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._6256_32_,auVar24);
  auVar25 = vfmadd231ps_avx512vl(auVar28,bezier_basis0._6256_32_,auVar25);
  auVar23 = vfmadd231ps_avx512vl(auVar23,bezier_basis0._5100_32_,auVar37);
  auVar35 = vfmadd231ps_avx512vl(auVar24,bezier_basis0._5100_32_,auVar35);
  auVar36 = vfmadd231ps_avx512vl(auVar25,bezier_basis0._5100_32_,auVar36);
  auVar26 = vbroadcastss_avx512vl(ZEXT416(0x3d638e39));
  auVar25 = vmulps_avx512vl(auVar23,auVar26);
  auVar27 = vmulps_avx512vl(auVar35,auVar26);
  auVar28 = vmulps_avx512vl(auVar36,auVar26);
  auVar35 = vblendps_avx(auVar25,ZEXT432(0) << 0x20,1);
  auVar36 = vblendps_avx(auVar27,ZEXT432(0) << 0x20,1);
  auVar31 = ZEXT432(0) << 0x20;
  auVar23 = vblendps_avx(auVar28,auVar31,1);
  auVar24 = vsubps_avx(ZEXT1632(auVar19),auVar35);
  auVar29 = vsubps_avx512vl(auVar32,auVar36);
  auVar30 = vsubps_avx512vl(auVar33,auVar23);
  auVar35 = vblendps_avx(auVar25,auVar31,0x80);
  auVar36 = vblendps_avx(auVar27,auVar31,0x80);
  auVar23 = vblendps_avx(auVar28,auVar31,0x80);
  auVar35 = vaddps_avx512vl(ZEXT1632(auVar19),auVar35);
  auVar36 = vaddps_avx512vl(auVar32,auVar36);
  auVar23 = vaddps_avx512vl(auVar33,auVar23);
  auVar27 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
  auVar25 = vminps_avx512vl(auVar27,ZEXT1632(auVar19));
  auVar28 = vminps_avx512vl(auVar27,auVar32);
  auVar31 = vminps_avx512vl(auVar27,auVar33);
  auVar34 = vminps_avx512vl(auVar24,auVar35);
  auVar25 = vminps_avx(auVar25,auVar34);
  auVar34 = vminps_avx512vl(auVar29,auVar36);
  auVar34 = vminps_avx512vl(auVar28,auVar34);
  auVar28 = vminps_avx512vl(auVar30,auVar23);
  auVar31 = vminps_avx512vl(auVar31,auVar28);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar28 = vmaxps_avx512vl(auVar37,ZEXT1632(auVar19));
  auVar32 = vmaxps_avx512vl(auVar37,auVar32);
  auVar33 = vmaxps_avx512vl(auVar37,auVar33);
  auVar35 = vmaxps_avx512vl(auVar24,auVar35);
  auVar38 = vmaxps_avx512vl(auVar28,auVar35);
  auVar35 = vmaxps_avx512vl(auVar29,auVar36);
  auVar32 = vmaxps_avx512vl(auVar32,auVar35);
  auVar35 = vmaxps_avx(auVar30,auVar23);
  auVar33 = vmaxps_avx512vl(auVar33,auVar35);
  auVar35 = vbroadcastss_avx512vl(auVar20);
  auVar36 = vpermps_avx512vl(auVar42,ZEXT1632(auVar20));
  auVar23 = vpermps_avx512vl(auVar43,ZEXT1632(auVar20));
  auVar24 = vbroadcastss_avx512vl(auVar22);
  auVar28 = vpermps_avx512vl(auVar42,ZEXT1632(auVar22));
  auVar29 = vpermps_avx512vl(auVar43,ZEXT1632(auVar22));
  auVar30 = vbroadcastss_avx512vl(auVar21);
  auVar39 = vpermps_avx512vl(auVar42,ZEXT1632(auVar21));
  auVar40 = vpermps_avx512vl(auVar43,ZEXT1632(auVar21));
  auVar41 = vbroadcastss_avx512vl(auVar18);
  auVar42 = vpermps_avx512vl(auVar42,ZEXT1632(auVar18));
  auVar43 = vpermps_avx512vl(auVar43,ZEXT1632(auVar18));
  auVar44 = vmulps_avx512vl(auVar41,bezier_basis0._3944_32_);
  auVar45 = vmulps_avx512vl(auVar42,bezier_basis0._3944_32_);
  auVar46 = vmulps_avx512vl(auVar43,bezier_basis0._3944_32_);
  auVar44 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._2788_32_,auVar30);
  auVar45 = vfmadd231ps_avx512vl(auVar45,bezier_basis0._2788_32_,auVar39);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar40,bezier_basis0._2788_32_);
  auVar44 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._1632_32_,auVar24);
  auVar45 = vfmadd231ps_avx512vl(auVar45,bezier_basis0._1632_32_,auVar28);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar29,bezier_basis0._1632_32_);
  auVar19 = vfmadd231ps_fma(auVar44,bezier_basis0._476_32_,auVar35);
  auVar18 = vfmadd231ps_fma(auVar45,bezier_basis0._476_32_,auVar36);
  auVar44 = vfmadd231ps_avx512vl(auVar46,auVar23,bezier_basis0._476_32_);
  auVar41 = vmulps_avx512vl(auVar41,bezier_basis0._8568_32_);
  auVar42 = vmulps_avx512vl(auVar42,bezier_basis0._8568_32_);
  auVar43 = vmulps_avx512vl(auVar43,bezier_basis0._8568_32_);
  auVar30 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._7412_32_,auVar30);
  auVar39 = vfmadd231ps_avx512vl(auVar42,bezier_basis0._7412_32_,auVar39);
  auVar40 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._7412_32_,auVar40);
  auVar24 = vfmadd231ps_avx512vl(auVar30,bezier_basis0._6256_32_,auVar24);
  auVar28 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._6256_32_,auVar28);
  auVar29 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._6256_32_,auVar29);
  auVar22 = vfmadd231ps_fma(auVar24,bezier_basis0._5100_32_,auVar35);
  auVar21 = vfmadd231ps_fma(auVar28,bezier_basis0._5100_32_,auVar36);
  auVar35 = vfmadd231ps_avx512vl(auVar29,bezier_basis0._5100_32_,auVar23);
  auVar28 = vmulps_avx512vl(ZEXT1632(auVar22),auVar26);
  auVar39 = vmulps_avx512vl(ZEXT1632(auVar21),auVar26);
  auVar26 = vmulps_avx512vl(auVar35,auVar26);
  auVar40 = ZEXT432(0) << 0x20;
  auVar35 = vblendps_avx(auVar28,auVar40,1);
  auVar36 = vblendps_avx(auVar39,auVar40,1);
  auVar23 = vblendps_avx(auVar26,auVar40,1);
  auVar24 = vsubps_avx(ZEXT1632(auVar19),auVar35);
  auVar29 = vsubps_avx(ZEXT1632(auVar18),auVar36);
  auVar30 = vsubps_avx(auVar44,auVar23);
  auVar35 = vblendps_avx(auVar28,auVar40,0x80);
  auVar36 = vblendps_avx(auVar39,auVar40,0x80);
  auVar23 = vblendps_avx(auVar26,auVar40,0x80);
  auVar39._0_4_ = auVar19._0_4_ + auVar35._0_4_;
  auVar39._4_4_ = auVar19._4_4_ + auVar35._4_4_;
  auVar39._8_4_ = auVar19._8_4_ + auVar35._8_4_;
  auVar39._12_4_ = auVar19._12_4_ + auVar35._12_4_;
  auVar39._16_4_ = auVar35._16_4_ + 0.0;
  auVar39._20_4_ = auVar35._20_4_ + 0.0;
  auVar39._24_4_ = auVar35._24_4_ + 0.0;
  auVar39._28_4_ = auVar35._28_4_ + 0.0;
  auVar40._0_4_ = auVar18._0_4_ + auVar36._0_4_;
  auVar40._4_4_ = auVar18._4_4_ + auVar36._4_4_;
  auVar40._8_4_ = auVar18._8_4_ + auVar36._8_4_;
  auVar40._12_4_ = auVar18._12_4_ + auVar36._12_4_;
  auVar40._16_4_ = auVar36._16_4_ + 0.0;
  auVar40._20_4_ = auVar36._20_4_ + 0.0;
  auVar40._24_4_ = auVar36._24_4_ + 0.0;
  auVar40._28_4_ = auVar36._28_4_ + 0.0;
  auVar41._0_4_ = auVar44._0_4_ + auVar23._0_4_;
  auVar41._4_4_ = auVar44._4_4_ + auVar23._4_4_;
  auVar41._8_4_ = auVar44._8_4_ + auVar23._8_4_;
  auVar41._12_4_ = auVar44._12_4_ + auVar23._12_4_;
  auVar41._16_4_ = auVar44._16_4_ + auVar23._16_4_;
  auVar41._20_4_ = auVar44._20_4_ + auVar23._20_4_;
  auVar41._24_4_ = auVar44._24_4_ + auVar23._24_4_;
  auVar41._28_4_ = auVar44._28_4_ + auVar23._28_4_;
  auVar36 = vminps_avx512vl(auVar27,ZEXT1632(auVar19));
  auVar23 = vminps_avx512vl(auVar27,ZEXT1632(auVar18));
  auVar28 = vminps_avx512vl(auVar27,auVar44);
  auVar35 = vminps_avx(auVar24,auVar39);
  auVar26 = vminps_avx(auVar36,auVar35);
  auVar35 = vminps_avx(auVar29,auVar40);
  auVar27 = vminps_avx(auVar23,auVar35);
  auVar35 = vminps_avx(auVar30,auVar41);
  auVar28 = vminps_avx(auVar28,auVar35);
  auVar36 = vmaxps_avx512vl(auVar37,ZEXT1632(auVar19));
  auVar23 = vmaxps_avx512vl(auVar37,ZEXT1632(auVar18));
  auVar37 = vmaxps_avx512vl(auVar37,auVar44);
  auVar35 = vmaxps_avx(auVar24,auVar39);
  auVar35 = vmaxps_avx(auVar36,auVar35);
  auVar36 = vmaxps_avx(auVar29,auVar40);
  auVar36 = vmaxps_avx(auVar23,auVar36);
  auVar23 = vmaxps_avx(auVar30,auVar41);
  auVar23 = vmaxps_avx(auVar37,auVar23);
  auVar24 = vshufps_avx512vl(auVar38,auVar38,0xb1);
  auVar29 = vmaxps_avx512vl(auVar38,auVar24);
  auVar24 = vshufpd_avx(auVar29,auVar29,5);
  auVar24 = vmaxps_avx(auVar29,auVar24);
  auVar19 = vmaxps_avx(auVar24._0_16_,auVar24._16_16_);
  auVar24 = vshufps_avx512vl(auVar32,auVar32,0xb1);
  auVar29 = vmaxps_avx512vl(auVar32,auVar24);
  auVar24 = vshufpd_avx(auVar29,auVar29,5);
  auVar24 = vmaxps_avx(auVar29,auVar24);
  auVar18 = vmaxps_avx(auVar24._0_16_,auVar24._16_16_);
  auVar18 = vunpcklps_avx(auVar19,auVar18);
  auVar24 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar24 = vmaxps_avx(auVar33,auVar24);
  auVar29 = vshufpd_avx(auVar24,auVar24,5);
  auVar24 = vmaxps_avx(auVar24,auVar29);
  auVar19 = vmaxps_avx(auVar24._0_16_,auVar24._16_16_);
  auVar19 = vinsertps_avx(auVar18,auVar19,0x28);
  auVar24 = vshufps_avx(auVar25,auVar25,0xb1);
  auVar24 = vminps_avx(auVar25,auVar24);
  auVar25 = vshufpd_avx(auVar24,auVar24,5);
  auVar24 = vminps_avx(auVar24,auVar25);
  auVar18 = vminps_avx(auVar24._0_16_,auVar24._16_16_);
  auVar24 = vshufps_avx(auVar34,auVar34,0xb1);
  auVar24 = vminps_avx(auVar34,auVar24);
  auVar25 = vshufpd_avx(auVar24,auVar24,5);
  auVar24 = vminps_avx(auVar24,auVar25);
  auVar22 = vminps_avx(auVar24._0_16_,auVar24._16_16_);
  auVar22 = vunpcklps_avx(auVar18,auVar22);
  auVar24 = vshufps_avx512vl(auVar31,auVar31,0xb1);
  auVar25 = vminps_avx512vl(auVar31,auVar24);
  auVar24 = vshufpd_avx(auVar25,auVar25,5);
  auVar24 = vminps_avx(auVar25,auVar24);
  auVar18 = vminps_avx(auVar24._0_16_,auVar24._16_16_);
  auVar18 = vinsertps_avx(auVar22,auVar18,0x28);
  auVar24 = vshufps_avx(auVar26,auVar26,0xb1);
  auVar24 = vminps_avx(auVar26,auVar24);
  auVar25 = vshufpd_avx(auVar24,auVar24,5);
  auVar24 = vminps_avx(auVar24,auVar25);
  auVar22 = vminps_avx(auVar24._0_16_,auVar24._16_16_);
  auVar24 = vshufps_avx(auVar27,auVar27,0xb1);
  auVar24 = vminps_avx(auVar27,auVar24);
  auVar25 = vshufpd_avx(auVar24,auVar24,5);
  auVar24 = vminps_avx(auVar24,auVar25);
  auVar21 = vminps_avx(auVar24._0_16_,auVar24._16_16_);
  auVar21 = vunpcklps_avx(auVar22,auVar21);
  auVar24 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar24 = vminps_avx(auVar28,auVar24);
  auVar25 = vshufpd_avx(auVar24,auVar24,5);
  auVar24 = vminps_avx(auVar24,auVar25);
  auVar22 = vminps_avx(auVar24._0_16_,auVar24._16_16_);
  auVar22 = vinsertps_avx(auVar21,auVar22,0x28);
  auVar21 = vminps_avx(auVar18,auVar22);
  auVar24 = vshufps_avx(auVar35,auVar35,0xb1);
  auVar35 = vmaxps_avx(auVar35,auVar24);
  auVar24 = vshufpd_avx(auVar35,auVar35,5);
  auVar35 = vmaxps_avx(auVar35,auVar24);
  auVar18 = vmaxps_avx(auVar35._0_16_,auVar35._16_16_);
  auVar35 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar35 = vmaxps_avx(auVar36,auVar35);
  auVar36 = vshufpd_avx(auVar35,auVar35,5);
  auVar35 = vmaxps_avx(auVar35,auVar36);
  auVar22 = vmaxps_avx(auVar35._0_16_,auVar35._16_16_);
  auVar22 = vunpcklps_avx(auVar18,auVar22);
  auVar35 = vshufps_avx(auVar23,auVar23,0xb1);
  auVar35 = vmaxps_avx(auVar23,auVar35);
  auVar36 = vshufpd_avx(auVar35,auVar35,5);
  auVar35 = vmaxps_avx(auVar35,auVar36);
  auVar18 = vmaxps_avx(auVar35._0_16_,auVar35._16_16_);
  auVar18 = vinsertps_avx(auVar22,auVar18,0x28);
  auVar22 = vmaxps_avx(auVar19,auVar18);
  auVar18._8_4_ = 0x7fffffff;
  auVar18._0_8_ = 0x7fffffff7fffffff;
  auVar18._12_4_ = 0x7fffffff;
  auVar19 = vandps_avx(auVar21,auVar18);
  auVar18 = vandps_avx(auVar22,auVar18);
  auVar19 = vmaxps_avx(auVar19,auVar18);
  auVar18 = vmovshdup_avx(auVar19);
  auVar18 = vmaxss_avx(auVar18,auVar19);
  auVar19 = vshufpd_avx(auVar19,auVar19,1);
  auVar19 = vmaxss_avx(auVar19,auVar18);
  fVar69 = auVar19._0_4_ * 4.7683716e-07;
  auVar19._4_4_ = fVar69;
  auVar19._0_4_ = fVar69;
  auVar19._8_4_ = fVar69;
  auVar19._12_4_ = fVar69;
  aVar11 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar21,auVar19);
  (__return_storage_ptr__->lower).field_0 = aVar11;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar22._0_4_ + fVar69;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar22._4_4_ + fVar69;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar22._8_4_ + fVar69;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar22._12_4_ + fVar69;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(size_t i) const {
        return bounds(i);
      }